

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.cpp
# Opt level: O2

void __thiscall Event::Event(Event *this,EventRegister *_register,string *name)

{
  this->m_eventRegister = _register;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  (this->m_listeners).super__Vector_base<Callable,_std::allocator<Callable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_listeners).super__Vector_base<Callable,_std::allocator<Callable>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_listeners).super__Vector_base<Callable,_std::allocator<Callable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Event::Event(EventRegister *_register, std::string name)
    : m_eventRegister(_register),
      m_name{std::move(name)}
{
}